

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderCase.cpp
# Opt level: O2

void deqp::egl::getDefaultRenderFilterLists
               (vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
                *filterLists,FilterList *baseFilters)

{
  EGLint EVar1;
  FilterList *pFVar2;
  long lVar3;
  long lVar4;
  allocator<char> local_f9;
  vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> *local_f8;
  FilterList *local_f0;
  long local_e8;
  anon_struct_16_2_3c8bed26 *local_e0;
  char *local_d8;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  RenderFilterList filters;
  
  lVar3 = 0;
  local_f8 = filterLists;
  local_f0 = baseFilters;
  while (lVar3 != 5) {
    local_e0 = getDefaultRenderFilterLists::s_colorRules + lVar3;
    local_d8 = getDefaultRenderFilterLists::s_colorRules[lVar3].name;
    lVar4 = 0x10;
    local_e8 = lVar3;
    while( true ) {
      if (lVar4 == 0x58) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,local_d8,&local_f9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filters,
                     &local_b0,"_");
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &filters,
                     *(char **)((long)&getDefaultRenderFilterLists::s_colorRules[4].name + lVar4));
      std::__cxx11::string::~string((string *)&filters);
      std::__cxx11::string::~string((string *)&local_b0);
      EVar1 = *(EGLint *)((long)&getDefaultRenderFilterLists::s_colorRules[4].filter + lVar4);
      NamedFilterList::NamedFilterList(&filters.super_NamedFilterList,name._M_dataplus._M_p,"");
      filters.m_surfaceTypeMask = EVar1;
      pFVar2 = eglu::FilterList::operator<<((FilterList *)&filters,local_f0);
      pFVar2 = eglu::FilterList::operator<<(pFVar2,local_e0->filter);
      pFVar2 = eglu::FilterList::operator<<
                         (pFVar2,*(ConfigFilter *)
                                  ((long)&getDefaultRenderFilterLists::s_surfaceRules[0].name +
                                  lVar4));
      eglu::FilterList::operator<<(pFVar2,isConformant);
      std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::
      push_back(local_f8,&filters);
      NamedFilterList::~NamedFilterList(&filters.super_NamedFilterList);
      std::__cxx11::string::~string((string *)&name);
      lVar4 = lVar4 + 0x18;
    }
    lVar3 = local_e8 + 1;
  }
  NamedFilterList::NamedFilterList(&filters.super_NamedFilterList,"other","");
  filters.m_surfaceTypeMask = 7;
  pFVar2 = eglu::FilterList::operator<<((FilterList *)&filters,local_f0);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<5,6,5,0>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<8,8,8,0>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<4,4,4,4>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<5,5,5,1>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,notColorBits<8,8,8,8>);
  pFVar2 = eglu::FilterList::operator<<(pFVar2,isConformant);
  eglu::FilterList::operator<<(pFVar2,notFloat);
  std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::push_back
            (local_f8,&filters);
  NamedFilterList::~NamedFilterList(&filters.super_NamedFilterList);
  return;
}

Assistant:

void getDefaultRenderFilterLists (vector<RenderFilterList>& filterLists, const eglu::FilterList& baseFilters)
{
	static const struct
	{
		const char*			name;
		eglu::ConfigFilter	filter;
	} s_colorRules[] =
	{
		{ "rgb565",		colorBits<5, 6, 5, 0>	},
		{ "rgb888",		colorBits<8, 8, 8, 0>	},
		{ "rgba4444",	colorBits<4, 4, 4, 4>	},
		{ "rgba5551",	colorBits<5, 5, 5, 1>	},
		{ "rgba8888",	colorBits<8, 8, 8, 8>	},
	};

	static const struct
	{
		const char*			name;
		EGLint				bits;
		eglu::ConfigFilter	filter;
	} s_surfaceRules[] =
	{
		{ "window",		EGL_WINDOW_BIT,		surfaceType<EGL_WINDOW_BIT>		},
		{ "pixmap",		EGL_PIXMAP_BIT,		surfaceType<EGL_PIXMAP_BIT>,	},
		{ "pbuffer",	EGL_PBUFFER_BIT,	surfaceType<EGL_PBUFFER_BIT>	}
	};

	for (int colorNdx = 0; colorNdx < DE_LENGTH_OF_ARRAY(s_colorRules); colorNdx++)
	{
		for (int surfaceNdx = 0; surfaceNdx < DE_LENGTH_OF_ARRAY(s_surfaceRules); surfaceNdx++)
		{
			const string		name	= string(s_colorRules[colorNdx].name) + "_" + s_surfaceRules[surfaceNdx].name;
			RenderFilterList	filters	(name.c_str(), "", s_surfaceRules[surfaceNdx].bits);

			filters << baseFilters
					<< s_colorRules[colorNdx].filter
					<< s_surfaceRules[surfaceNdx].filter
					<< isConformant;

			filterLists.push_back(filters);
		}
	}

	// Add other config ids to "other" set
	{
		RenderFilterList	filters	("other", "", EGL_WINDOW_BIT|EGL_PIXMAP_BIT|EGL_PBUFFER_BIT);

		filters << baseFilters
				<< notColorBits<5, 6, 5, 0>
				<< notColorBits<8, 8, 8, 0>
				<< notColorBits<4, 4, 4, 4>
				<< notColorBits<5, 5, 5, 1>
				<< notColorBits<8, 8, 8, 8>
				<< isConformant
				<< notFloat;

		filterLists.push_back(filters);
	}
}